

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O2

void print_gotos(int stateno)

{
  shifts *psVar1;
  long lVar2;
  
  putc(10,(FILE *)verbose_file);
  psVar1 = shift_table[stateno];
  for (lVar2 = 0; lVar2 < psVar1->nshifts; lVar2 = lVar2 + 1) {
    if (start_symbol <= accessing_symbol[psVar1->shift[lVar2]]) {
      fprintf((FILE *)verbose_file,"\t%s  goto %d\n",
              symbol_name[accessing_symbol[psVar1->shift[lVar2]]]);
    }
  }
  return;
}

Assistant:

void print_gotos(int stateno)
{
    register int i, k;
    register int as;
    register Yshort *to_state;
    register shifts *sp;

    putc('\n', verbose_file);
    sp = shift_table[stateno];
    to_state = sp->shift;
    for (i = 0; i < sp->nshifts; ++i)
    {
	k = to_state[i];
	as = accessing_symbol[k];
	if (ISVAR(as))
	    fprintf(verbose_file, "\t%s  goto %d\n", symbol_name[as], k);
    }
}